

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O2

void __thiscall despot::Floor::AddCell(Floor *this,Coord coord)

{
  Coord local_8;
  
  this->floor_[(long)coord >> 0x20][coord.x] =
       (int)((ulong)((long)(this->cells_).
                           super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->cells_).
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  local_8 = coord;
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back(&this->cells_,&local_8);
  return;
}

Assistant:

void Floor::AddCell(Coord coord) {
	floor_[coord.y][coord.x] = cells_.size();
	cells_.push_back(coord);
}